

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputAndInputParameterOfSameTypeInSameFunctionCall_Test::
testBody(TEST_MockComparatorCopierTest_customTypeOutputAndInputParameterOfSameTypeInSameFunctionCall_Test
         *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  char *pcVar5;
  char *pcVar6;
  TestTerminator *pTVar7;
  SimpleString local_210;
  SimpleString local_200;
  SimpleString local_1f0;
  SimpleString local_1e0;
  SimpleString local_1d0;
  SimpleString local_1c0;
  SimpleString local_1b0;
  SimpleString local_1a0;
  SimpleString local_190;
  SimpleString local_180;
  SimpleString local_170;
  SimpleString local_160;
  SimpleString local_150;
  SimpleString local_140;
  SimpleString local_130;
  SimpleString local_120;
  SimpleString local_110;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  MyTypeForTestingComparator local_70;
  MyTypeForTestingComparator comparator;
  MyTypeForTestingCopier copier;
  MyTypeForTesting actualObject2;
  MyTypeForTesting expectedObject2;
  undefined1 local_30 [8];
  MyTypeForTesting actualObject1;
  MyTypeForTesting expectedObject1;
  TEST_MockComparatorCopierTest_customTypeOutputAndInputParameterOfSameTypeInSameFunctionCall_Test
  *this_local;
  
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)&actualObject1.value,0x2d);
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)local_30,0x2d);
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)&actualObject2.value,0x3ae01ac3);
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)&copier,0);
  MyTypeForTestingCopier::MyTypeForTestingCopier((MyTypeForTestingCopier *)&comparator);
  MyTypeForTestingComparator::MyTypeForTestingComparator(&local_70);
  SimpleString::SimpleString(&local_80,"");
  pMVar2 = mock(&local_80,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_90,&comparator);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::SimpleString(&local_a0,"");
  pMVar2 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b0,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2c])(pMVar2,&local_b0,&local_70);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_c0,"");
  pMVar2 = mock(&local_c0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_d0,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_d0);
  SimpleString::SimpleString(&local_e0,"MyTypeForTesting");
  SimpleString::SimpleString(&local_f0,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_e0,&local_f0,
                              &actualObject1.value);
  SimpleString::SimpleString(&local_100,"MyTypeForTesting");
  SimpleString::SimpleString(&local_110,"bar");
  (**(code **)(*plVar3 + 0x38))(plVar3,&local_100,&local_110,&actualObject2.value);
  SimpleString::~SimpleString(&local_110);
  SimpleString::~SimpleString(&local_100);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::SimpleString(&local_120,"");
  pMVar2 = mock(&local_120,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_130,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_130);
  SimpleString::SimpleString(&local_140,"MyTypeForTesting");
  SimpleString::SimpleString(&local_150,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x20))
                             ((long *)CONCAT44(extraout_var_00,iVar1),&local_140,&local_150,local_30
                             );
  SimpleString::SimpleString(&local_160,"MyTypeForTesting");
  SimpleString::SimpleString(&local_170,"bar");
  (**(code **)(*plVar3 + 0x30))(plVar3,&local_160,&local_170,&copier);
  SimpleString::~SimpleString(&local_170);
  SimpleString::~SimpleString(&local_160);
  SimpleString::~SimpleString(&local_150);
  SimpleString::~SimpleString(&local_140);
  SimpleString::~SimpleString(&local_130);
  SimpleString::~SimpleString(&local_120);
  SimpleString::SimpleString(&local_180,"");
  pMVar2 = mock(&local_180,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_180);
  if (*expectedObject1._vptr_MyTypeForTesting == (_func_int *)0x2d) {
    pUVar4 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1a9,pTVar7);
  }
  else {
    if (*expectedObject1._vptr_MyTypeForTesting != *expectedObject1._vptr_MyTypeForTesting) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                 ,0x1a9);
    }
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_190);
    pcVar5 = SimpleString::asCharString(&local_190);
    ::StringFrom((long)&local_1a0);
    pcVar6 = SimpleString::asCharString(&local_1a0);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1a9,pTVar7);
    SimpleString::~SimpleString(&local_1a0);
    SimpleString::~SimpleString(&local_190);
  }
  if (*actualObject1._vptr_MyTypeForTesting == (_func_int *)0x2d) {
    pUVar4 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1aa,pTVar7);
  }
  else {
    if (*actualObject1._vptr_MyTypeForTesting != *actualObject1._vptr_MyTypeForTesting) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                 ,0x1aa);
    }
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_1b0);
    pcVar5 = SimpleString::asCharString(&local_1b0);
    ::StringFrom((long)&local_1c0);
    pcVar6 = SimpleString::asCharString(&local_1c0);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1aa,pTVar7);
    SimpleString::~SimpleString(&local_1c0);
    SimpleString::~SimpleString(&local_1b0);
  }
  if (*expectedObject2._vptr_MyTypeForTesting == (_func_int *)0x3ae01ac3) {
    pUVar4 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1ab,pTVar7);
  }
  else {
    if (*expectedObject2._vptr_MyTypeForTesting != *expectedObject2._vptr_MyTypeForTesting) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                 ,0x1ab);
    }
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_1d0);
    pcVar5 = SimpleString::asCharString(&local_1d0);
    ::StringFrom((long)&local_1e0);
    pcVar6 = SimpleString::asCharString(&local_1e0);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1ab,pTVar7);
    SimpleString::~SimpleString(&local_1e0);
    SimpleString::~SimpleString(&local_1d0);
  }
  if (*actualObject2._vptr_MyTypeForTesting == (_func_int *)0x3ae01ac3) {
    pUVar4 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1ac,pTVar7);
  }
  else {
    if (*actualObject2._vptr_MyTypeForTesting != *actualObject2._vptr_MyTypeForTesting) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                 ,0x1ac);
    }
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_1f0);
    pcVar5 = SimpleString::asCharString(&local_1f0);
    ::StringFrom((long)&local_200);
    pcVar6 = SimpleString::asCharString(&local_200);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1ac,pTVar7);
    SimpleString::~SimpleString(&local_200);
    SimpleString::~SimpleString(&local_1f0);
  }
  SimpleString::SimpleString(&local_210,"");
  pMVar2 = mock(&local_210,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])();
  SimpleString::~SimpleString(&local_210);
  MyTypeForTestingComparator::~MyTypeForTestingComparator(&local_70);
  MyTypeForTestingCopier::~MyTypeForTestingCopier((MyTypeForTestingCopier *)&comparator);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)&copier);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)&actualObject2.value);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)local_30);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)&actualObject1.value);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputAndInputParameterOfSameTypeInSameFunctionCall)
{
    MyTypeForTesting expectedObject1(45);
    MyTypeForTesting actualObject1(45);
    MyTypeForTesting expectedObject2(987765443);
    MyTypeForTesting actualObject2(0);
    MyTypeForTestingCopier copier;
    MyTypeForTestingComparator comparator;
    mock().installCopier("MyTypeForTesting", copier);
    mock().installComparator("MyTypeForTesting", comparator);

    mock().expectOneCall("foo")
          .withParameterOfType("MyTypeForTesting", "bar", &expectedObject1)
          .withOutputParameterOfTypeReturning("MyTypeForTesting", "bar", &expectedObject2);
    mock().actualCall("foo")
          .withParameterOfType("MyTypeForTesting", "bar", &actualObject1)
          .withOutputParameterOfType("MyTypeForTesting", "bar", &actualObject2);

    mock().checkExpectations();
    CHECK_EQUAL(45, *(expectedObject1.value));
    CHECK_EQUAL(45, *(actualObject1.value));
    CHECK_EQUAL(987765443, *(expectedObject2.value));
    CHECK_EQUAL(987765443, *(actualObject2.value));

    mock().removeAllComparatorsAndCopiers();
}